

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

bool __thiscall
dg::vr::RelationsAnalyzer::canShift
          (RelationsAnalyzer *this,ValueRelations *graph,V param,Type shift)

{
  long lVar1;
  _Base_ptr p_Var2;
  pointer ppVVar3;
  Value *pVVar4;
  V lt;
  StructureAnalyzer *this_00;
  V val_00;
  ValueRelations *pVVar5;
  bool bVar6;
  uint uVar7;
  VectorSet<const_llvm::Value_*> *pVVar8;
  _Rb_tree_node_base *p_Var9;
  Function *func;
  V rt;
  Relations RVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [8];
  Value **val;
  pointer ppVVar14;
  V local_80;
  RelationsAnalyzer *local_78;
  ValueRelations *local_70;
  undefined1 local_68 [8];
  _Rb_tree_node_base local_60;
  _Base_bitset<1UL> local_38;
  
  lVar1 = *(long *)param;
  local_80 = param;
  bVar6 = ValueRelations::has<llvm::Value_const*>(graph,&local_80,(Relations)0xfff);
  if ((!bVar6) || (*(char *)(*(long *)local_80 + 8) != '\r')) {
    return false;
  }
  uVar11 = (ulong)shift;
  if (shift < (UGE|ULE)) {
    uVar12 = 1L << ((byte)shift & 0x3f);
    local_78 = this;
    uVar7 = dg::vr::Relations::getNonStrict(shift);
    uVar11 = (ulong)uVar7;
    if (uVar7 < 0xc) {
      local_38._M_w = uVar12 | 1L << (uVar11 & 0x3f);
      ValueRelations::getRelated<llvm::Value_const*>
                ((RelationsMap *)local_68,graph,&local_80,(Relations *)&local_38);
      p_Var9 = local_60._M_left;
      pVVar5 = graph;
      if (local_60._M_left != &local_60) {
        do {
          local_70 = pVVar5;
          p_Var2 = p_Var9[1]._M_parent;
          pVVar8 = ValueRelations::getEqual(local_70,*(Handle *)(p_Var9 + 1));
          ppVVar3 = (pVVar8->vec).
                    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppVVar14 = (pVVar8->vec).
                          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppVVar14 != ppVVar3;
              ppVVar14 = ppVVar14 + 1) {
            pVVar4 = *ppVVar14;
            if (((char)*(uint *)(*(long *)pVVar4 + 8) == '\r') &&
               (*(uint *)(*(long *)pVVar4 + 8) >> 8 <= *(uint *)(lVar1 + 8) >> 8)) {
              if (((ulong)p_Var2 & uVar12) != 0) {
LAB_0011e1e0:
                std::
                _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                ::_M_erase((_Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                            *)local_68,(_Link_type)local_60._M_parent);
                return true;
              }
              if (pVVar4[0x10] == (Value)0x10) {
                if (shift == SLT) {
                  bVar6 = llvm::APInt::isMaxSignedValue((APInt *)(pVVar4 + 0x18));
                }
                else {
                  if (shift != SGT) goto LAB_0011e1e0;
                  bVar6 = llvm::APInt::isMinSignedValue((APInt *)(pVVar4 + 0x18));
                }
                if (bVar6 == false) goto LAB_0011e1e0;
              }
            }
          }
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          graph = local_70;
          pVVar5 = local_70;
        } while (p_Var9 != &local_60);
      }
      std::
      _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
      ::_M_erase((_Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                  *)local_68,(_Link_type)local_60._M_parent);
      val_00 = local_80;
      if (local_80 == (V)0x0) {
        return false;
      }
      if ((byte)local_80[0x10] < 0x1b) {
        return false;
      }
      func = (Function *)llvm::Instruction::getFunction();
      ValueRelations::getEqual((VectorSet<const_llvm::Value_*> *)local_68,graph,val_00);
      auVar13 = local_68;
      if (local_68 == (undefined1  [8])local_60._0_8_) {
        bVar6 = true;
      }
      else {
        do {
          lt = *(V *)auVar13;
          if (((lt != (V)0x0) && (lt[0x10] == (Value)0x14)) && ((*(Type **)lt)[8] == (Type)0xd)) {
            rt = (V)llvm::ConstantInt::get(*(Type **)lt,0,false);
            RVar10 = ValueRelations::_between(graph,lt,rt);
            this_00 = *(StructureAnalyzer **)(local_78 + 0x40);
            if (((ulong)RVar10.bits.super__Base_bitset<1UL>._M_w & 2) != 0) {
              shift = dg::vr::Relations::getNonStrict(shift);
            }
            StructureAnalyzer::addPrecondition(this_00,func,(Argument *)lt,shift,rt);
            bVar6 = false;
            goto LAB_0011e249;
          }
          auVar13 = (undefined1  [8])((long)auVar13 + 8);
        } while (auVar13 != (undefined1  [8])local_60._0_8_);
        bVar6 = true;
      }
LAB_0011e249:
      if (local_68 != (undefined1  [8])0x0) {
        operator_delete((void *)local_68,(long)local_60._M_parent - (long)local_68);
      }
      if (bVar6) {
        return false;
      }
      return true;
    }
  }
  std::__throw_out_of_range_fmt
            ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar11,0xc);
}

Assistant:

bool RelationsAnalyzer::canShift(const ValueRelations &graph, V param,
                                 Relations::Type shift) {
    const auto *paramType = param->getType();
    assert(Relations::isStrict(shift) && Relations::isSigned(shift));
    if (!graph.hasAnyRelation(param) || !param->getType()->isIntegerTy())
        return false;

    // if there is a value lesser/greater with same or smaller range, then param
    // is also inc/decrementable
    for (auto pair : graph.getRelated(
                 param,
                 Relations().set(shift).set(Relations::getNonStrict(shift)))) {
        for (const auto &val : graph.getEqual(pair.first)) {
            const auto *valType = val->getType();
            if (valType->isIntegerTy() &&
                valType->getIntegerBitWidth() <=
                        paramType->getIntegerBitWidth()) {
                if (pair.second.has(shift))
                    return true;
                assert(pair.second.has(Relations::getNonStrict(shift)));
                if (const auto *c = llvm::dyn_cast<llvm::ConstantInt>(val)) {
                    if (!(shift == Relations::SGT && c->isMinValue(true)) &&
                        !(shift == Relations::SLT && c->isMaxValue(true)))
                        return true;
                }
            }
        }
    }

    // if the shifted value is a parameter, it depends on the passed value;
    // check when validating
    if (const auto *paramInst = llvm::dyn_cast<llvm::Instruction>(param)) {
        const llvm::Function *thisFun = paramInst->getFunction();

        for (const auto *val : graph.getEqual(paramInst)) {
            if (const auto *arg = llvm::dyn_cast<llvm::Argument>(val)) {
                if (arg->getType()->isIntegerTy()) {
                    const auto *zero =
                            llvm::ConstantInt::get(arg->getType(), 0);
                    if (graph.are(arg, Relations::NE, zero))
                        structure.addPrecondition(
                                thisFun, arg, Relations::getNonStrict(shift),
                                zero);
                    else
                        structure.addPrecondition(thisFun, arg, shift, zero);
                    return true;
                }
            }
        }
    }
    return false;
}